

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O2

void FAudio_OPERATIONSET_QueueSetVolume(FAudioVoice *voice,float Volume,uint32_t OperationSet)

{
  FAudio_OPERATIONSET_Operation *pFVar1;
  
  FAudio_PlatformLockMutex(voice->audio->operationLock);
  pFVar1 = QueueOperation(voice,FAUDIOOP_SETVOLUME,OperationSet);
  (pFVar1->Data).EnableEffect.EffectIndex = (uint32_t)Volume;
  FAudio_PlatformUnlockMutex(voice->audio->operationLock);
  return;
}

Assistant:

void FAudio_OPERATIONSET_QueueSetVolume(
	FAudioVoice *voice,
	float Volume,
	uint32_t OperationSet
) {
	FAudio_OPERATIONSET_Operation *op;

	FAudio_PlatformLockMutex(voice->audio->operationLock);
	LOG_MUTEX_LOCK(voice->audio, voice->audio->operationLock)

	op = QueueOperation(
		voice,
		FAUDIOOP_SETVOLUME,
		OperationSet
	);

	op->Data.SetVolume.Volume = Volume;

	FAudio_PlatformUnlockMutex(voice->audio->operationLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->audio->operationLock)
}